

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void changeLpMatrixCoefficient
               (HighsLp *lp,HighsInt row,HighsInt col,double new_value,bool zero_new_value)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  value_type in_XMM0_Qa;
  HighsInt el_2;
  HighsInt i_1;
  HighsInt new_num_nz_1;
  HighsInt el_1;
  HighsInt i;
  HighsInt new_num_nz;
  HighsInt el;
  HighsInt change_el;
  size_type in_stack_ffffffffffffffa8;
  value_type vVar4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  value_type vVar5;
  int local_3c;
  int local_38;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  
  local_20 = -1;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)in_EDX);
  local_24 = *pvVar2;
  do {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)(in_EDX + 1));
    if (*pvVar2 <= local_24) {
LAB_004fd2a4:
      if (local_20 < 0) {
        if ((in_CL & 1) != 0) {
          return;
        }
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)(in_EDX + 1))
        ;
        local_20 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)*in_RDI);
        local_30 = *pvVar2;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8);
        for (local_2c = in_EDX + 1; local_2c <= *in_RDI; local_2c = local_2c + 1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_2c);
          *pvVar2 = *pvVar2 + 1;
        }
        for (; local_20 < local_30; local_30 = local_30 + -1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),
                              (long)(local_30 + -1));
          vVar5 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)local_30);
          *pvVar2 = vVar5;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x36),
                              (long)(local_30 + -1));
          vVar4 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x36),
                              (long)local_30);
          *pvVar3 = vVar4;
        }
      }
      else if ((in_CL & 1) != 0) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)*in_RDI);
        iVar1 = *pvVar2;
        for (local_38 = in_EDX + 1; local_38 <= *in_RDI; local_38 = local_38 + 1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)local_38);
          *pvVar2 = *pvVar2 + -1;
        }
        for (local_3c = local_20; local_3c < iVar1 + -1; local_3c = local_3c + 1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),
                              (long)(local_3c + 1));
          vVar5 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)local_3c);
          *pvVar2 = vVar5;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x36),
                              (long)(local_3c + 1));
          vVar4 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x36),
                              (long)local_3c);
          *pvVar3 = vVar4;
        }
        return;
      }
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)local_20);
      *pvVar2 = in_ESI;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x36),(long)local_20)
      ;
      *pvVar3 = in_XMM0_Qa;
      return;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)local_24);
    if (*pvVar2 == in_ESI) {
      local_20 = local_24;
      goto LAB_004fd2a4;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void changeLpMatrixCoefficient(HighsLp& lp, const HighsInt row,
                               const HighsInt col, const double new_value,
                               const bool zero_new_value) {
  assert(0 <= row && row < lp.num_row_);
  assert(0 <= col && col < lp.num_col_);

  // Determine whether the coefficient corresponds to an existing
  // nonzero
  HighsInt change_el = -1;
  for (HighsInt el = lp.a_matrix_.start_[col];
       el < lp.a_matrix_.start_[col + 1]; el++) {
    if (lp.a_matrix_.index_[el] == row) {
      change_el = el;
      break;
    }
  }
  if (change_el < 0) {
    // Coefficient doesn't correspond to an existing nonzero
    //
    // If coefficient is small, then just ignore it
    if (zero_new_value) return;
    // New nonzero goes at the end of column "col", so have to shift
    // all index and value entries forward by 1 to accommodate it
    change_el = lp.a_matrix_.start_[col + 1];
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] + 1;
    lp.a_matrix_.index_.resize(new_num_nz);
    lp.a_matrix_.value_.resize(new_num_nz);
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]++;
    for (HighsInt el = new_num_nz - 1; el > change_el; el--) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el - 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el - 1];
    }
  } else if (zero_new_value) {
    // Coefficient zeroes an existing nonzero, so shift all index and
    // value entries backward by 1 to eliminate it
    HighsInt new_num_nz = lp.a_matrix_.start_[lp.num_col_] - 1;
    for (HighsInt i = col + 1; i <= lp.num_col_; i++) lp.a_matrix_.start_[i]--;
    for (HighsInt el = change_el; el < new_num_nz; el++) {
      lp.a_matrix_.index_[el] = lp.a_matrix_.index_[el + 1];
      lp.a_matrix_.value_[el] = lp.a_matrix_.value_[el + 1];
    }
    return;
  }
  lp.a_matrix_.index_[change_el] = row;
  lp.a_matrix_.value_[change_el] = new_value;
}